

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * QDir::toNativeSeparators(QString *pathName)

{
  QString *in_RSI;
  QString *in_RDI;
  
  QString::QString(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

QString QDir::toNativeSeparators(const QString &pathName)
{
#if defined(Q_OS_WIN)
    qsizetype i = pathName.indexOf(u'/');
    if (i != -1) {
        QString n(pathName);

        QChar * const data = n.data();
        data[i++] = u'\\';

        for (; i < n.length(); ++i) {
            if (data[i] == u'/')
                data[i] = u'\\';
        }

        return n;
    }
#endif
    return pathName;
}